

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_cmp_joliet_identifier(isoent *p1,isoent *p2)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *__s1;
  char *__s2;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  size_t __n;
  ulong __n_00;
  
  __s1 = p1->identifier;
  __s2 = p2->identifier;
  iVar2 = p1->ext_off;
  iVar3 = p2->ext_off;
  iVar8 = iVar3;
  if (iVar2 < iVar3) {
    iVar8 = iVar2;
  }
  __n = (size_t)iVar8;
  iVar8 = memcmp(__s1,__s2,__n);
  if (iVar8 != 0) {
    return iVar8;
  }
  if (iVar2 < iVar3) {
    lVar9 = 0;
    while (iVar3 - iVar2 != (int)lVar9) {
      lVar7 = lVar9 + __n;
      lVar9 = lVar9 + 1;
      if (__s2[lVar7] != 0) {
        return -(uint)(byte)__s2[lVar7];
      }
    }
  }
  else if (iVar3 < iVar2) {
    lVar9 = 0;
    while (iVar2 - iVar3 != (int)lVar9) {
      lVar7 = lVar9 + __n;
      lVar9 = lVar9 + 1;
      if (__s1[lVar7] != 0) {
        return (uint)(byte)__s1[lVar7];
      }
    }
  }
  uVar4 = p1->ext_len;
  if (uVar4 == 2) {
    if (p2->ext_len == 2) {
      return 0;
    }
  }
  else if ((uVar4 == 0) && (p2->ext_len == 0)) {
    return 0;
  }
  if ((int)uVar4 < 3) {
    return -1;
  }
  uVar5 = p2->ext_len;
  if (2 < (int)uVar5) {
    uVar6 = uVar5;
    if ((int)uVar4 < (int)uVar5) {
      uVar6 = uVar4;
    }
    __n_00 = (ulong)uVar6;
    iVar8 = memcmp(__s1 + iVar2,__s2 + iVar3,__n_00);
    if (iVar8 == 0) {
      if ((int)uVar4 < (int)uVar5) {
        lVar9 = 0;
        do {
          if (uVar5 - uVar4 == (int)lVar9) {
            return 0;
          }
          bVar1 = (__s2 + iVar3)[lVar9 + __n_00];
          lVar9 = lVar9 + 1;
        } while (bVar1 == 0);
        return -(uint)bVar1;
      }
      if ((int)uVar5 < (int)uVar4) {
        lVar9 = 0;
        while (uVar4 - uVar5 != (int)lVar9) {
          bVar1 = (__s1 + iVar2)[lVar9 + __n_00];
          lVar9 = lVar9 + 1;
          if (bVar1 != 0) {
            return (uint)bVar1;
          }
        }
      }
      return 0;
    }
    return iVar8;
  }
  return 1;
}

Assistant:

static int
isoent_cmp_joliet_identifier(const struct isoent *p1, const struct isoent *p2)
{
	const unsigned char *s1, *s2;
	int cmp;
	int l;

	s1 = (const unsigned char *)p1->identifier;
	s2 = (const unsigned char *)p2->identifier;

	/* Compare File Name */
	l = p1->ext_off;
	if (l > p2->ext_off)
		l = p2->ext_off;
	cmp = memcmp(s1, s2, l);
	if (cmp != 0)
		return (cmp);
	if (p1->ext_off < p2->ext_off) {
		s2 += l;
		l = p2->ext_off - p1->ext_off;
		while (l--)
			if (0 != *s2++)
				return (- *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_off > p2->ext_off) {
		s1 += l;
		l = p1->ext_off - p2->ext_off;
		while (l--)
			if (0 != *s1++)
				return (*(const unsigned char *)(s1 - 1));
	}
	/* Compare File Name Extension */
	if (p1->ext_len == 0 && p2->ext_len == 0)
		return (0);
	if (p1->ext_len == 2 && p2->ext_len == 2)
		return (0);
	if (p1->ext_len <= 2)
		return (-1);
	if (p2->ext_len <= 2)
		return (1);
	l = p1->ext_len;
	if (l > p2->ext_len)
		l = p2->ext_len;
	s1 = (unsigned char *)(p1->identifier + p1->ext_off);
	s2 = (unsigned char *)(p2->identifier + p2->ext_off);
	if (l > 1) {
		cmp = memcmp(s1, s2, l);
		if (cmp != 0)
			return (cmp);
	}
	if (p1->ext_len < p2->ext_len) {
		s2 += l;
		l = p2->ext_len - p1->ext_len;
		while (l--)
			if (0 != *s2++)
				return (- *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_len > p2->ext_len) {
		s1 += l;
		l = p1->ext_len - p2->ext_len;
		while (l--)
			if (0 != *s1++)
				return (*(const unsigned char *)(s1 - 1));
	}
	/* Compare File Version Number */
	/* No operation. The File Version Number is always one. */

	return (cmp);
}